

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f)

{
  int iVar1;
  param512_t *papVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int y;
  long lVar8;
  float fVar9;
  
  iVar6 = f->ofst;
  iVar7 = iVar6;
  while( true ) {
    iVar4 = f->sizy;
    iVar3 = iVar6;
    if (iVar4 - iVar6 <= iVar7) break;
    for (; iVar3 < f->sizx - iVar6; iVar3 = iVar3 + 1) {
      for (lVar8 = 0; lVar8 < f->sizz; lVar8 = lVar8 + 1) {
        fVar9 = dx(c,f,iVar7,iVar3,(int)lVar8);
        (*f->param_ptr[lVar8])[f->res * iVar7 + iVar3].fx = fVar9;
        fVar9 = dy(c,f,iVar7,iVar3,(int)lVar8);
        (*f->param_ptr[lVar8])[f->res * iVar7 + iVar3].fy = fVar9;
      }
      iVar6 = f->ofst;
    }
    iVar7 = iVar7 + 1;
  }
  iVar3 = (int)((double)c->sizz * 0.5);
  for (iVar7 = iVar6; iVar1 = iVar6, iVar7 < iVar4 - iVar6; iVar7 = iVar7 + 1) {
    iVar1 = f->sizx;
    for (lVar8 = (long)iVar6; y = (int)lVar8, y < iVar1 - iVar6; lVar8 = lVar8 + 1) {
      papVar2 = f->param_ptr[iVar3];
      lVar5 = (long)f->res * (long)iVar7 + lVar8;
      if ((*papVar2)[lVar5].err == 0) {
        fVar9 = dt(c,(qnode_ptr_t)(long)iVar7,iVar7,y);
        (*papVar2)[lVar5].ft = fVar9;
        fVar9 = dxt(f,iVar7,y);
        (*papVar2)[lVar5].fxt = fVar9;
        fVar9 = dyt(f,iVar7,y);
        (*papVar2)[lVar5].fyt = fVar9;
      }
    }
  }
  for (; iVar1 < iVar4 - iVar6; iVar1 = iVar1 + 1) {
    lVar8 = (long)iVar1;
    for (lVar5 = (long)iVar6; iVar7 = (int)lVar5, iVar7 < f->sizx - iVar6; lVar5 = lVar5 + 1) {
      if ((*f->param_ptr[iVar3])[f->res * lVar8 + lVar5].err == 0) {
        fVar9 = dxx(f,iVar1,iVar7,iVar3);
        (*f->param_ptr[iVar3])[f->res * lVar8 + lVar5].fxx = fVar9;
        fVar9 = dyy(f,iVar1,iVar7,iVar3);
        (*f->param_ptr[iVar3])[f->res * lVar8 + lVar5].fyy = fVar9;
        fVar9 = dxy(f,iVar1,iVar7,iVar3);
        (*f->param_ptr[iVar3])[f->res * lVar8 + lVar5].fxy = fVar9;
        iVar6 = f->ofst;
      }
    }
    iVar4 = f->sizy;
  }
  return;
}

Assistant:

void compute_deriv(c,f)
qnode_ptr_t c, f ;

{ float dxx(), dyy(), dxy(), dx(), dy(), dt(), dxt(), dyt() ;
  int i, j, k ;
param_t P ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2.0 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fxt = dxt(f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fyt = dyt(f,i,j) ;
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
      }
    }
  }
}